

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall test_solvers_3x3_nonnumeric::test_method(test_solvers_3x3_nonnumeric *this)

{
  ulong uVar1;
  pointer pdVar2;
  duration<long,_boost::ratio<1L,_1L>_> *pdVar3;
  size_t expected_assignment [3];
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  matrix;
  seconds costs [9];
  allocator_type local_b9;
  unsigned_long local_b8 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  local_80;
  duration<long,_boost::ratio<1L,_1L>_> local_58 [9];
  
  pdVar3 = local_58;
  local_58[0].rep_ = 1;
  local_58[1].rep_ = 2;
  local_58[2].rep_ = 4;
  local_58[3].rep_ = 0;
  local_58[4].rep_ = 2;
  local_58[5].rep_ = 0xffffffffffffffff;
  local_58[6].rep_ = 3;
  local_58[7].rep_ = 0;
  local_58[8].rep_ = 0xfffffffffffffffd;
  local_b8[0] = 1;
  local_b8[1] = 0;
  local_b8[2] = 2;
  boost::numeric::ublas::
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  ::matrix(&local_80,3,3);
  uVar1 = 10;
  pdVar2 = local_80.data_.data_;
  do {
    if (pdVar3 != pdVar2) {
      pdVar2->rep_ = pdVar3->rep_;
    }
    pdVar3 = pdVar3 + 1;
    pdVar2 = pdVar2 + 1;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,local_b8,local_b8 + 3,
             &local_b9);
  assert_solvers_result<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
            (&local_80,(duration<long,_boost::ratio<1L,_1L>_>)0xffffffffffffffff,&local_98,
             (less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)&local_b9);
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.data_.size_ != 0) {
    operator_delete(local_80.data_.data_);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3_nonnumeric)
{
  using boost::chrono::seconds;
  const seconds costs[] = {seconds(1), seconds(2), seconds(4),
                           seconds(0), seconds(2), seconds(-1),
                           seconds(3), seconds(0), seconds(-3)};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), seconds(-1), make_vector(expected_assignment, 3));
}